

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O1

void __thiscall discordpp::ReadyEvent::~ReadyEvent(ReadyEvent *this)

{
  _Head_base<0UL,_std::array<int,_2UL>_*,_false> _Var1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  _Tuple_impl<0UL,_int_*,_std::default_delete<int>_> _Var3;
  pointer *__ptr;
  
  std::unique_ptr<discordpp::Application,_std::default_delete<discordpp::Application>_>::~unique_ptr
            (&(this->application).t_);
  _Var1._M_head_impl =
       (this->shard).super_field<std::array<int,_2UL>_>.t_._M_t.
       super___uniq_ptr_impl<std::array<int,_2UL>,_std::default_delete<std::array<int,_2UL>_>_>._M_t
       .super__Tuple_impl<0UL,_std::array<int,_2UL>_*,_std::default_delete<std::array<int,_2UL>_>_>.
       super__Head_base<0UL,_std::array<int,_2UL>_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (array<int,_2UL> *)0x0) {
    operator_delete(_Var1._M_head_impl,8);
  }
  (this->shard).super_field<std::array<int,_2UL>_>.t_._M_t.
  super___uniq_ptr_impl<std::array<int,_2UL>,_std::default_delete<std::array<int,_2UL>_>_>._M_t.
  super__Tuple_impl<0UL,_std::array<int,_2UL>_*,_std::default_delete<std::array<int,_2UL>_>_>.
  super__Head_base<0UL,_std::array<int,_2UL>_*,_false>._M_head_impl = (array<int,_2UL> *)0x0;
  _Var2._M_head_impl =
       (this->resume_gateway_url).t_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var2._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&this->resume_gateway_url,_Var2._M_head_impl);
  }
  (this->resume_gateway_url).t_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var2._M_head_impl =
       (this->session_id).t_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var2._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&this->session_id,_Var2._M_head_impl);
  }
  (this->session_id).t_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  unique_ptr<std::vector<discordpp::Guild,_std::allocator<discordpp::Guild>_>,_std::default_delete<std::vector<discordpp::Guild,_std::allocator<discordpp::Guild>_>_>_>
  ::~unique_ptr(&(this->guilds).t_);
  std::unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_>::~unique_ptr
            (&(this->user).t_);
  _Var3.super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (this->v).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>;
  if (_Var3.super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
    operator_delete((void *)_Var3.super__Head_base<0UL,_int_*,_false>._M_head_impl,4);
  }
  (this->v).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false> =
       (_Head_base<0UL,_int_*,_false>)0x0;
  return;
}

Assistant:

ReadyEvent(
        field<int> v = uninitialized,
        field<User> user = uninitialized,
        field<std::vector<Guild> > guilds = uninitialized,
        field<std::string> session_id = uninitialized,
        field<std::string> resume_gateway_url = uninitialized,
        omittable_field<std::array<int, 2>> shard = omitted,
        field<Application> application = uninitialized
    ):
        v(v),
        user(user),
        guilds(guilds),
        session_id(session_id),
        resume_gateway_url(resume_gateway_url),
        shard(shard),
        application(application)
    {}